

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

int mixed_buffer_from_pack(mixed_pack *in,mixed_buffer **outs,float *volume,float target_volume)

{
  byte bVar1;
  mixed_encoding encoding;
  mixed_buffer *pmVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  void *pvVar6;
  char *pack;
  float fVar7;
  float fVar8;
  byte bVar9;
  uint32_t uVar10;
  ulong uVar11;
  int8_t c;
  char cVar12;
  uint32_t i;
  float *apfStack_70 [2];
  float **local_60;
  float *local_58;
  void *local_50;
  char *ind;
  float local_40;
  uint local_3c;
  float local_38;
  uint32_t local_34 [2];
  uint32_t frames;
  
  bVar1 = in->channels;
  apfStack_70[0] = (float *)0x12a8cb;
  local_58 = volume;
  local_38 = target_volume;
  bVar9 = mixed_samplesize(in->encoding);
  local_34[0] = 0xffffffff;
  lVar4 = -(ulong)((uint)bVar1 * 8 + 0xf & 0xfffffff0);
  local_60 = apfStack_70 + 1;
  ind = (char *)in;
  *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a905;
  mixed_pack_request_read(&local_50,local_34,in);
  local_34[0] = local_34[0] / ((uint)bVar9 * (uint)bVar1);
  local_3c = (uint)bVar9 * (uint)bVar1;
  for (uVar11 = 0; (uint)bVar1 * 8 != uVar11; uVar11 = uVar11 + 8) {
    pmVar2 = *(mixed_buffer **)((long)outs + uVar11);
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a937;
    mixed_buffer_request_write
              ((float **)((long)apfStack_70 + uVar11 + lVar4 + -0x68 + 0x70),local_34,pmVar2);
  }
  if (local_34[0] == 0) {
    uVar10 = 0;
  }
  else {
    encoding = *(mixed_encoding *)(ind + 0x18);
    apfStack_70[1] = (float *)transfer_array_functions_from[encoding - MIXED_INT8];
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a961;
    bVar9 = mixed_samplesize(encoding);
    local_40 = *local_58;
    *local_58 = local_38;
    for (cVar12 = '\0'; uVar10 = local_34[0], fVar8 = local_38, fVar7 = local_40, pvVar6 = local_50,
        pfVar5 = apfStack_70[1], (int)cVar12 < (int)(uint)bVar1; cVar12 = cVar12 + '\x01') {
      pfVar3 = *(float **)((long)apfStack_70 + (long)cVar12 * 8 + lVar4 + -0x68 + 0x70U);
      *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a9a6;
      (*(code *)pfVar5)(pvVar6,pfVar3,bVar1,uVar10,fVar7,fVar8);
      local_50 = (void *)((long)local_50 + (ulong)bVar9);
    }
  }
  pack = ind;
  uVar10 = uVar10 * local_3c;
  *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a9c3;
  mixed_pack_finish_read(uVar10,(mixed_pack *)pack);
  for (uVar11 = 0; uVar10 = local_34[0], bVar1 != uVar11; uVar11 = uVar11 + 1) {
    pmVar2 = outs[uVar11];
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12a9d7;
    mixed_buffer_finish_write(uVar10,pmVar2);
  }
  local_60[0xffffffffffffffff] = (float *)0x1;
  return (int)local_60[0xffffffffffffffff];
}

Assistant:

int mixed_buffer_from_pack(struct mixed_pack *in, struct mixed_buffer **outs, float *volume, float target_volume){
  mixed_channel_t channels = in->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(in->encoding);
  uint32_t frames = UINT32_MAX;
  char *ind;
  float *outd[channels];

  mixed_pack_request_read((void**)&ind, &frames, in);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_write(&outd[i], &frames, outs[i]);

  if(0 < frames){
    mixed_transfer_function_from fun = transfer_array_functions_from[in->encoding-1];
    uint8_t size = mixed_samplesize(in->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind, outd[c], channels, frames, vol, target_volume);
      ind += size;
    }
  }

  mixed_pack_finish_read(frames * frames_to_bytes, in);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_write(frames, outs[i]);
  
  return 1;
}